

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.c
# Opt level: O3

size_t utf8_range_ValidPrefix(char *data,size_t len)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *data_00;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  ulong *end;
  
  if (len == 0) {
    return 0;
  }
  end = (ulong *)(data + len);
  puVar2 = (ulong *)data;
  pcVar5 = data;
  if (7 < (long)len) {
    do {
      if ((*puVar2 & 0x8080808080808080) != 0) break;
      puVar2 = puVar2 + 1;
      pcVar5 = pcVar5 + 8;
      len = len - 8;
    } while (7 < (long)len);
  }
  data_00 = puVar2;
  if (puVar2 < end) {
    lVar4 = (long)end - (long)pcVar5;
    puVar1 = (ulong *)((long)puVar2 + lVar4);
    do {
      data_00 = puVar2;
      if ((char)*puVar2 < '\0') break;
      puVar2 = (ulong *)((long)puVar2 + 1);
      lVar4 = lVar4 + -1;
      data_00 = puVar1;
    } while (lVar4 != 0);
  }
  sVar3 = utf8_range_ValidateUTF8Naive((char *)data_00,(char *)end,1);
  return (long)data_00 + (sVar3 - (long)data);
}

Assistant:

static FORCE_INLINE_ATTR inline size_t utf8_range_Validate(
    const char* data, size_t len, int return_position) {
  if (len == 0) return 1 - return_position;
  // Save buffer start address for later use
  const char* const data_original = data;
  const char* const end = data + len;
  data = utf8_range_SkipAscii(data, end);
  /* SIMD algorithm always outperforms the naive version for any data of
     length >=16.
   */
  if (end - data < 16) {
    return (return_position ? (data - data_original) : 0) +
           utf8_range_ValidateUTF8Naive(data, end, return_position);
  }
#if defined(__SSE4_1__) || (defined(__ARM_NEON) && defined(__ARM_64BIT_STATE))
  return utf8_range_ValidateUTF8Simd(
      data_original, data, end, return_position);
#else
  return (return_position ? (data - data_original) : 0) +
         utf8_range_ValidateUTF8Naive(data, end, return_position);
#endif
}